

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O0

size_t __thiscall
tchecker::pool_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>::
collect(pool_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_> *this
       )

{
  size_t sVar1;
  void **ppvVar2;
  make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL> *t;
  refcount_t *refcount;
  char *chunk;
  void *block_end;
  void *block;
  void *collected_end;
  void *collected_begin;
  size_t collected;
  pool_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_> *this_local
  ;
  
  collected_begin = (void *)0x0;
  collected_end = (void *)0x0;
  block = (void *)0x0;
  block_end = this->_block_head;
  while (block_end != (void *)0x0) {
    sVar1 = this->_block_size;
    for (refcount = (refcount_t *)first_chunk_ptr(block_end);
        (refcount != (refcount_t *)((long)block_end + sVar1) &&
        ((refcount < this->_raw_head || (this->_raw_end <= refcount))));
        refcount = (refcount_t *)(this->_alloc_size + (long)refcount)) {
      if (*refcount == 0) {
        *refcount = 0xffffffffffffffff;
        make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>::destruct
                  ((make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL> *)
                   (refcount + 1));
        ppvVar2 = nextchunk(refcount);
        *ppvVar2 = collected_end;
        if (block == (void *)0x0) {
          block = refcount;
        }
        collected_end = refcount;
        collected_begin = (void *)((long)collected_begin + 1);
      }
    }
    ppvVar2 = nextblock(block_end);
    block_end = *ppvVar2;
  }
  if (collected_begin != (void *)0x0) {
    release(this,collected_end,block);
  }
  return (size_t)collected_begin;
}

Assistant:

std::size_t collect()
  {
    std::size_t collected = 0;
    void *collected_begin = nullptr, *collected_end = nullptr;

    // Move to the free list all chunks in blocks list that are not in the
    // free list and that are unused
    for (void * block = _block_head; block != nullptr; block = nextblock(block)) {
      void * block_end = static_cast<char *>(block) + _block_size;

      for (char * chunk = first_chunk_ptr(block); chunk != block_end; chunk += _alloc_size) {
        // Ignore chunks inside unused raw block (refcount not set yet)
        if ((_raw_head <= chunk) && (chunk < _raw_end))
          break; // ignore the entire raw block

        // Collect all unused chunks in the free list
        typename T::refcount_t * refcount = reinterpret_cast<typename T::refcount_t *>(chunk);
        if (*refcount == COLLECTABLE_CHUNK) {
          // make the chunk free using its refcount
          *refcount = FREE_CHUNK;
          // destruct the object in the chunk
          T * t = reinterpret_cast<T *>(refcount + 1);
          T::destruct(t); // t->~T()
          // add the chunk to the list of collected chunks
          this->nextchunk(chunk) = collected_begin;
          if (collected_end == nullptr)
            collected_end = chunk;
          collected_begin = chunk;
          ++collected;
        }
      }
    }

    // release the collected chunks
    if (collected > 0)
      this->release(collected_begin, collected_end);

    return collected;
  }